

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void enableRawMouseMotion(_GLFWwindow *window)

{
  uchar mask [3];
  XIEventMask em;
  uchar local_1b [2];
  byte local_19;
  XIEventMask local_18;
  
  memset(local_1b,0,3);
  local_18.deviceid = 1;
  local_18.mask_len = 3;
  local_18.mask = local_1b;
  local_19 = local_19 | 2;
  (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,&local_18,1);
  return;
}

Assistant:

static void enableRawMouseMotion(_GLFWwindow* window)
{
    XIEventMask em;
    unsigned char mask[XIMaskLen(XI_RawMotion)] = { 0 };

    em.deviceid = XIAllMasterDevices;
    em.mask_len = sizeof(mask);
    em.mask = mask;
    XISetMask(mask, XI_RawMotion);

    XISelectEvents(_glfw.x11.display, _glfw.x11.root, &em, 1);
}